

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

SummaryColumn * __thiscall
Catch::ConsoleReporter::SummaryColumn::addRow
          (SummaryColumn *__return_storage_ptr__,SummaryColumn *this,size_t count)

{
  undefined8 uVar1;
  pointer pcVar2;
  pointer __rhs;
  ostringstream local_1f8 [8];
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string row;
  
  std::__cxx11::ostringstream::ostringstream(local_1f8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
  row.field_2._8_8_ = __return_storage_ptr__;
  std::__cxx11::stringbuf::str();
  for (__rhs = (this->rows).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __rhs != (this->rows).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
    while( true ) {
      pcVar2 = (pointer)__rhs->_M_string_length;
      if (row._M_dataplus._M_p <= pcVar2) break;
      std::operator+(&local_80," ",__rhs);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    while (row._M_dataplus._M_p < pcVar2) {
      std::operator+(&local_80," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      pcVar2 = (pointer)__rhs->_M_string_length;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->rows,(value_type *)local_60);
  uVar1 = row.field_2._8_8_;
  SummaryColumn((SummaryColumn *)row.field_2._8_8_,this);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::ostringstream::~ostringstream(local_1f8);
  return (SummaryColumn *)uVar1;
}

Assistant:

SummaryColumn addRow( std::size_t count ) {
                std::ostringstream oss;
                oss << count;
                std::string row = oss.str();
                for( std::vector<std::string>::iterator it = rows.begin(); it != rows.end(); ++it ) {
                    while( it->size() < row.size() )
                        *it = " " + *it;
                    while( it->size() > row.size() )
                        row = " " + row;
                }
                rows.push_back( row );
                return *this;
            }